

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall
QtMWidgets::DateTimePickerPrivate::updateCurrentDateTime(DateTimePickerPrivate *this)

{
  Section *pSVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  undefined8 local_70;
  int local_64;
  int local_60;
  int local_5c;
  ulong local_58;
  int local_4c;
  QDateTime *local_48;
  QTime local_3c;
  QDate local_38;
  
  local_70 = QDateTime::date();
  iVar2 = QDate::year();
  local_70 = QDateTime::date();
  iVar3 = QDate::month();
  uVar4 = QDateTime::time();
  local_70._0_4_ = uVar4;
  local_58 = QTime::hour();
  local_70._0_4_ = QDateTime::time();
  local_5c = QTime::minute();
  local_70._0_4_ = QDateTime::time();
  local_60 = QTime::second();
  uVar4 = QDateTime::time();
  local_70 = CONCAT44(local_70._4_4_,uVar4);
  local_4c = QTime::msec();
  if ((this->super_DateTimeParser).sections.d.size < 1) {
    iVar6 = -1;
    local_64 = -1;
  }
  else {
    local_48 = &this->minimum;
    local_64 = -1;
    lVar7 = 0x28;
    lVar9 = 0;
    iVar6 = -1;
    do {
      pSVar1 = (this->super_DateTimeParser).sections.d.ptr;
      iVar5 = *(int *)((long)pSVar1 + lVar7 + -0x28);
      if (iVar5 < 0x80) {
        if (iVar5 < 0x10) {
          switch(iVar5) {
          case 1:
            local_64 = *(int *)((long)&pSVar1->type + lVar7);
            break;
          case 2:
            local_60 = *(int *)((long)&pSVar1->type + lVar7);
            break;
          case 4:
            local_5c = *(int *)((long)&pSVar1->type + lVar7);
            break;
          case 8:
switchD_0015c4b2_caseD_8:
            local_58 = (ulong)*(uint *)((long)&pSVar1->type + lVar7);
          }
        }
        else {
          if (iVar5 == 0x10) goto switchD_0015c4b2_caseD_8;
          if ((iVar5 == 0x20) || (iVar5 == 0x40)) goto LAB_0015c4f5;
        }
      }
      else if (iVar5 < 0x400) {
        if (iVar5 == 0x80) {
LAB_0015c4f5:
          iVar6 = *(int *)((long)&pSVar1->type + lVar7) + 1;
        }
        else if ((iVar5 == 0x100) || (iVar5 == 0x200)) goto LAB_0015c541;
      }
      else if (iVar5 == 0x400) {
LAB_0015c541:
        iVar3 = *(int *)((long)&pSVar1->type + lVar7) + 1;
      }
      else if ((iVar5 == 0x800) || (iVar5 == 0x1000)) {
        local_70 = QDateTime::date();
        iVar2 = QDate::year();
        iVar2 = iVar2 + *(int *)((long)&((this->super_DateTimeParser).sections.d.ptr)->type + lVar7)
        ;
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 0x30;
    } while (lVar9 < (this->super_DateTimeParser).sections.d.size);
  }
  iVar5 = 1;
  if (iVar6 != -1) {
    iVar5 = iVar6;
  }
  iVar6 = (int)local_58;
  if (local_64 == 0) {
    iVar8 = 0;
    if (iVar6 != 0xb) {
      iVar8 = iVar6 + 1;
    }
  }
  else {
    iVar8 = iVar6;
    if (local_64 == 1) {
      iVar8 = 0xc;
      if (iVar6 != 0xb) {
        iVar8 = iVar6 + 0xd;
      }
    }
  }
  QDate::QDate(&local_38,iVar2,iVar3,iVar5);
  QTime::QTime(&local_3c,iVar8,local_5c,local_60,local_4c);
  QDateTime::QDateTime((QDateTime *)&local_70,local_38,local_3c,this->spec,0);
  setValue(this,(QDateTime *)&local_70,false);
  QDateTime::~QDateTime((QDateTime *)&local_70);
  return;
}

Assistant:

void
DateTimePickerPrivate::updateCurrentDateTime()
{
	int year = value.date().year();
	int month = value.date().month();
	int day = -1;
	int hour = value.time().hour();
	int minute = value.time().minute();
	int second = value.time().second();
	int msecs = value.time().msec();
	int amPm = -1;

	for( int i = 0; i < sections.size(); ++i )
	{
		switch( sections.at( i ).type )
		{
			case Section::AmPmSection :
			{
				amPm = sections.at( i ).currentIndex;
			}
			break;

			case Section::SecondSection :
			{
				second = sections.at( i ).currentIndex;
			}
			break;

			case Section::MinuteSection :
			{
				minute = sections.at( i ).currentIndex;
			}
			break;

			case Section::Hour12Section :
			case Section::Hour24Section :
			{
				hour = sections.at( i ).currentIndex;
			}
			break;

			case Section::DaySection :
			case Section::DaySectionShort :
			case Section::DaySectionLong :
			{
				day = sections.at( i ).currentIndex + 1;
			}
			break;

			case Section::MonthSection :
			case Section::MonthSectionShort :
			case Section::MonthSectionLong :
			{
				month = sections.at( i ).currentIndex + 1;
			}
			break;

			case Section::YearSection :
			case Section::YearSection2Digits :
			{
				year = minimum.date().year() + sections.at( i ).currentIndex;
			}
			break;

			default:
				break;
		}
	}

	if( day == -1 )
		day = 1;

	if( amPm == 0 )
	{
		if( hour == 11 )
			hour = 0;
		else
			hour += 1;
	}
	else if( amPm == 1 )
	{
		if( hour == 11 )
			hour = 12;
		else
			hour += 12 + 1;
	}

	setValue( QDateTime( QDate( year, month, day ),
		QTime( hour, minute, second, msecs ), spec ), false );
}